

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void InitShaders(void)

{
  (*glad_glEnable)(0xb71);
  InitShader(&basicShaderId,
             "#version 330 core\nlayout(location = 0) in vec3 position;layout(location = 1) in vec2 texCoord;out vec2 v_TexCoord;void main() {   gl_Position = vec4(position.xy, -1, 1.0);   v_TexCoord = texCoord;}"
             ,
             "#version 330 core\nlayout(location = 0) out vec4 color;in vec2 v_TexCoord;uniform sampler2D u_Texture;void main() { vec4 texColor = texture(u_Texture, v_TexCoord);  color = texColor;}"
            );
  BindShader(&basicShaderId);
  SetUniform1i(&basicShaderId,"u_Texture",0);
  UnBindShader(&basicShaderId);
  return;
}

Assistant:

void InitShaders() {
    glEnable(GL_DEPTH_TEST);
    const char* basicVertexShader = ""
                                    "#version 330 core"
                                    "\n"
                                    "layout(location = 0) in vec3 position;"
                                    "layout(location = 1) in vec2 texCoord;"
                                    ""
                                    "out vec2 v_TexCoord;"
                                    ""
                                    "void main() {"
                                    "   gl_Position = vec4(position.xy, -1, 1.0);"
                                    "   v_TexCoord = texCoord;"
                                    "}";

    const char* basicFragmentShader = ""
                                      "#version 330 core"
                                      "\n"
                                      "layout(location = 0) out vec4 color;"
                                      ""
                                      "in vec2 v_TexCoord;"
                                      "uniform sampler2D u_Texture;"
                                      ""
                                      "void main() {"
                                      " vec4 texColor = texture(u_Texture, v_TexCoord);"
                                      " "
                                      " color = texColor;"
                                      "}";

    InitShader(&basicShaderId, basicVertexShader, basicFragmentShader);
    BindShader(&basicShaderId);
    SetUniform1i(&basicShaderId, "u_Texture", 0);
    UnBindShader(&basicShaderId);
}